

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

void cmSourceFileAddDepend(void *arg,char *depend)

{
  long lVar1;
  allocator<char> local_39;
  char *local_38;
  value_type local_30;
  
  lVar1 = *arg;
  local_38 = depend;
  if (lVar1 == 0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               ((long)arg + 0x68),&local_38);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,depend,&local_39);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(lVar1 + 0x110),&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

static void CCONV cmSourceFileAddDepend(void* arg, const char* depend)
{
  cmCPluginAPISourceFile* sf = static_cast<cmCPluginAPISourceFile*>(arg);
  if (cmSourceFile* rsf = sf->RealSourceFile) {
    rsf->AddDepend(depend);
  } else {
    sf->Depends.emplace_back(depend);
  }
}